

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void __thiscall TCMallocTest_ManyThreads_Test::TestBody(TCMallocTest_ManyThreads_Test *this)

{
  TesterThread *__p;
  undefined1 auVar1 [8];
  pointer ptVar2;
  tuple<TesterThread_*,_std::default_delete<TesterThread>_> this_00;
  ulong uVar3;
  _Head_base<0UL,_TesterThread_*,_false> _Var4;
  undefined1 auVar5 [8];
  TesterThread *extraout_RDX;
  TesterThread *extraout_RDX_00;
  TesterThread *extraout_RDX_01;
  TesterThread *__args;
  int id;
  thread *t;
  ulong uVar6;
  _Head_base<0UL,_TesterThread_*,_false> _Var7;
  long lVar8;
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  **ppvVar9;
  ulong __n;
  undefined1 auStack_78 [8];
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ptrs;
  undefined1 auStack_48 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  id = 0;
  printf("Testing threaded allocation/deallocation (%d threads)\n",10);
  auStack_78 = (undefined1  [8])0x0;
  ptrs.
  super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ptrs.
  super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ::reserve((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
             *)auStack_78,10);
  do {
    this_00.super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
    super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>)operator_new(0xa8);
    TesterThread::TesterThread
              ((TesterThread *)
               this_00.super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
               super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl,
               (vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
                *)auStack_78,id);
    auStack_48 = (undefined1  [8])
                 this_00.super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
                 super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>,std::allocator<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>>
    ::emplace_back<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>
              ((vector<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>,std::allocator<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>>
                *)auStack_78,
               (unique_ptr<TesterThread,_std::default_delete<TesterThread>_> *)auStack_48);
    if ((_Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>)auStack_48 !=
        (TesterThread *)0x0) {
      (**(code **)(*(long *)auStack_48 + 8))();
    }
    id = id + 1;
  } while (id != 10);
  auStack_48 = (undefined1  [8])0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_48,10);
  lVar8 = 0;
  __args = extraout_RDX;
  do {
    ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar1 = auStack_48;
    __p = (((pointer)((long)auStack_78 + lVar8 * 8))->_M_t).
          super___uniq_ptr_impl<TesterThread,_std::default_delete<TesterThread>_>._M_t.
          super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
          super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start - (long)auStack_48 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar6 = (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)auStack_48 >> 3;
      uVar3 = uVar6 + (uVar6 == 0);
      __n = uVar3 + uVar6;
      if (0xffffffffffffffe < __n) {
        __n = 0xfffffffffffffff;
      }
      if (CARRY8(uVar3,uVar6)) {
        __n = 0xfffffffffffffff;
      }
      if (__n == 0) {
        _Var4._M_head_impl = (TesterThread *)0x0;
      }
      else {
        _Var4._M_head_impl =
             (TesterThread *)
             __gnu_cxx::new_allocator<std::thread>::allocate
                       ((new_allocator<std::thread> *)auStack_48,__n,(void *)0x0);
        __args = extraout_RDX_01;
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,TCMallocTest_ManyThreads_Test::TestBody()::__0>
                ((allocator_type *)((id *)&(_Var4._M_head_impl)->_vptr_TesterThread + uVar6),
                 (thread *)__p,(anon_class_8_1_ba1d7bde_for__M_head_impl *)__args);
      _Var7._M_head_impl = _Var4._M_head_impl;
      for (auVar5 = auVar1; auVar5 != (undefined1  [8])ptVar2;
          auVar5 = (undefined1  [8])&((TesterThread *)auVar5)->all_threads_) {
        ((id *)&(_Var7._M_head_impl)->_vptr_TesterThread)->_M_thread =
             ((id *)&((TesterThread *)auVar5)->_vptr_TesterThread)->_M_thread;
        ((id *)&((TesterThread *)auVar5)->_vptr_TesterThread)->_M_thread = 0;
        _Var7._M_head_impl = (TesterThread *)&(_Var7._M_head_impl)->all_threads_;
      }
      if (auVar1 != (undefined1  [8])0x0) {
        operator_delete((void *)auVar1,
                        (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auVar1);
      }
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((id *)&(_Var4._M_head_impl)->_vptr_TesterThread + __n);
      auStack_48 = (undefined1  [8])_Var4._M_head_impl;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,TCMallocTest_ManyThreads_Test::TestBody()::__0>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start,(thread *)__p,
                 (anon_class_8_1_ba1d7bde_for__M_head_impl *)__args);
      _Var4._M_head_impl = extraout_RDX_00;
      _Var7._M_head_impl =
           (TesterThread *)
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    ppvVar9 = &(_Var7._M_head_impl)->all_threads_;
    lVar8 = lVar8 + 1;
    __args = _Var4._M_head_impl;
    _Var4._M_head_impl = (TesterThread *)auStack_48;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppvVar9;
  } while (lVar8 != 10);
  for (; _Var4._M_head_impl != (TesterThread *)ppvVar9;
      _Var4._M_head_impl = (TesterThread *)&(_Var4._M_head_impl)->all_threads_) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_48);
  std::
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ::~vector((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
             *)auStack_78);
  return;
}

Assistant:

TEST(TCMallocTest, ManyThreads) {
  printf("Testing threaded allocation/deallocation (%d threads)\n",
          FLAGS_numthreads);

  std::vector<std::unique_ptr<TesterThread>> ptrs;
  ptrs.reserve(FLAGS_numthreads);
  // Note, the logic inside PassObject requires us to create all
  // TesterThreads first, before starting any of them.
  for (int i = 0; i < FLAGS_numthreads; i++) {
    ptrs.emplace_back(std::make_unique<TesterThread>(ptrs, i));
  }

  std::vector<std::thread> threads;
  threads.reserve(FLAGS_numthreads);
  for (int i = 0; i < FLAGS_numthreads; i++) {
    threads.emplace_back([thr = ptrs[i].get()] () {
      thr->Run();
    });
  }
  for (auto& t : threads) {
    t.join();
  }
}